

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  cmSourceFile *this_00;
  pointer pbVar1;
  cmValue cVar2;
  cmMakefile *pcVar3;
  cmValue cVar4;
  cmValue cVar5;
  Value *pVVar6;
  string *psVar7;
  Value *pVVar8;
  ostream *poVar9;
  string *value;
  Value *this_01;
  string *c;
  pointer pbVar10;
  string *label;
  pointer pbVar11;
  string *li;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  allocator<char> local_631;
  string *local_630;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a0;
  string json_file;
  string file;
  string dir;
  Value lj_root;
  cmGeneratedFileStream fout;
  cmGeneratedFileStream json_fout;
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&dir,target);
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)dir._M_string_length;
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       dir._M_dataplus._M_p;
  json_fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&DAT_0000000b;
  json_fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       anon_var_dwarf_1202846;
  cmStrCat<>(&file,(cmAlphaNum *)&fout,(cmAlphaNum *)&json_fout);
  std::operator+(&json_file,&dir,"/Labels.json");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"LABELS",(allocator<char> *)&json_fout);
  cVar2 = cmGeneratorTarget::GetProperty(target,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar3 = cmTarget::GetMakefile(target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"LABELS",(allocator<char> *)&json_fout);
  cVar4 = cmMakefile::GetProperty(pcVar3,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar3 = cmTarget::GetMakefile(target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_DIRECTORY_LABELS",(allocator<char> *)&json_fout);
  cVar5 = cmMakefile::GetDefinition(pcVar3,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  local_630 = cVar5.Value;
  if ((cVar2.Value == (string *)0x0 && cVar4.Value == (string *)0x0) && cVar5.Value == (string *)0x0
     ) {
    cmsys::SystemTools::RemoveFile(&file);
    cmsys::SystemTools::RemoveFile(&json_file);
  }
  else {
    Json::Value::Value(&lj_root,objectValue);
    Json::Value::Value((Value *)&fout,objectValue);
    pVVar6 = Json::Value::operator[](&lj_root,"target");
    pVVar6 = Json::Value::operator=(pVVar6,(Value *)&fout);
    Json::Value::~Value((Value *)&fout);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value((Value *)&fout,psVar7);
    pVVar8 = Json::Value::operator[](pVVar6,"name");
    Json::Value::operator=(pVVar8,(Value *)&fout);
    Json::Value::~Value((Value *)&fout);
    Json::Value::Value((Value *)&fout,arrayValue);
    pVVar6 = Json::Value::operator[](pVVar6,"labels");
    pVVar6 = Json::Value::operator=(pVVar6,(Value *)&fout);
    Json::Value::~Value((Value *)&fout);
    Json::Value::Value((Value *)&fout,arrayValue);
    pVVar8 = Json::Value::operator[](&lj_root,"sources");
    pVVar8 = Json::Value::operator=(pVVar8,(Value *)&fout);
    Json::Value::~Value((Value *)&fout);
    cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (cVar2.Value != (string *)0x0) {
      arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar2.Value)->_M_string_length;
      cmExpandList(arg,&labels,false);
      if (labels.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          labels.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)&fout,"# Target labels\n");
        pbVar10 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = labels.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar10;
            pbVar11 = pbVar11 + 1) {
          poVar9 = std::operator<<((ostream *)&fout," ");
          poVar9 = std::operator<<(poVar9,(string *)pbVar11);
          std::operator<<(poVar9,"\n");
          Json::Value::Value((Value *)&json_fout,pbVar11);
          Json::Value::append(pVVar6,(Value *)&json_fout);
          Json::Value::~Value((Value *)&json_fout);
        }
      }
    }
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (cVar4.Value != (string *)0x0) {
      arg_00._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar4.Value)->_M_string_length;
      cmExpandList(arg_00,&directoryLabelsList,false);
    }
    if (local_630 != (string *)0x0) {
      arg_01._M_str = (local_630->_M_dataplus)._M_p;
      arg_01._M_len = local_630->_M_string_length;
      cmExpandList(arg_01,&cmakeDirectoryLabelsList,false);
    }
    if ((directoryLabelsList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         directoryLabelsList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (pbVar10 = directoryLabelsList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       cmakeDirectoryLabelsList.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       cmakeDirectoryLabelsList.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      std::operator<<((ostream *)&fout,"# Directory labels\n");
      pbVar10 = directoryLabelsList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (pbVar11 = directoryLabelsList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = cmakeDirectoryLabelsList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pbVar11 != pbVar10;
        pbVar11 = pbVar11 + 1) {
      poVar9 = std::operator<<((ostream *)&fout," ");
      poVar9 = std::operator<<(poVar9,(string *)pbVar11);
      std::operator<<(poVar9,"\n");
      Json::Value::Value((Value *)&json_fout,pbVar11);
      Json::Value::append(pVVar6,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
    }
    for (pbVar10 = cmakeDirectoryLabelsList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
        pbVar10 = pbVar10 + 1) {
      poVar9 = std::operator<<((ostream *)&fout," ");
      poVar9 = std::operator<<(poVar9,(string *)pbVar10);
      std::operator<<(poVar9,"\n");
      Json::Value::Value((Value *)&json_fout,pbVar10);
      Json::Value::append(pVVar6,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
    }
    std::operator<<((ostream *)&fout,"# Source files and their labels\n");
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar3 = cmTarget::GetMakefile(target->Target);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_5a0,pcVar3,IncludeEmptyConfig);
    for (pbVar10 = local_5a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 !=
        local_5a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
      cmGeneratorTarget::GetSourceFiles(target,&sources,pbVar10);
    }
    local_630 = (string *)
                cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                          (&sources);
    for (psVar7 = (string *)
                  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; psVar7 != local_630;
        psVar7 = (string *)&psVar7->_M_string_length) {
      this_00 = (cmSourceFile *)(psVar7->_M_dataplus)._M_p;
      Json::Value::Value((Value *)&json_fout,objectValue);
      pVVar6 = Json::Value::append(pVVar8,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
      value = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
      poVar9 = std::operator<<((ostream *)&fout,(string *)value);
      std::operator<<(poVar9,"\n");
      Json::Value::Value((Value *)&json_fout,value);
      this_01 = Json::Value::operator[](pVVar6,"file");
      Json::Value::operator=(this_01,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
      std::__cxx11::string::string<std::allocator<char>>((string *)&json_fout,"LABELS",&local_631);
      cVar2 = cmSourceFile::GetProperty(this_00,(string *)&json_fout);
      std::__cxx11::string::~string((string *)&json_fout);
      if (cVar2.Value != (string *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&labels);
        Json::Value::Value((Value *)&json_fout,arrayValue);
        pVVar6 = Json::Value::operator[](pVVar6,"labels");
        pVVar6 = Json::Value::operator=(pVVar6,(Value *)&json_fout);
        Json::Value::~Value((Value *)&json_fout);
        arg_02._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
        arg_02._M_len = (cVar2.Value)->_M_string_length;
        cmExpandList(arg_02,&labels,false);
        pbVar10 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = labels.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar10;
            pbVar11 = pbVar11 + 1) {
          poVar9 = std::operator<<((ostream *)&fout," ");
          poVar9 = std::operator<<(poVar9,(string *)pbVar11);
          std::operator<<(poVar9,"\n");
          Json::Value::Value((Value *)&json_fout,pbVar11);
          Json::Value::append(pVVar6,(Value *)&json_fout);
          Json::Value::~Value((Value *)&json_fout);
        }
      }
    }
    cmGeneratedFileStream::cmGeneratedFileStream(&json_fout,&json_file,false,None);
    Json::operator<<((OStream *)&json_fout,&lj_root);
    cmGeneratedFileStream::~cmGeneratedFileStream(&json_fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5a0);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeDirectoryLabelsList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&directoryLabelsList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&labels);
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    Json::Value::~Value(&lj_root);
  }
  std::__cxx11::string::~string((string *)&json_file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = cmStrCat(dir, "/Labels.txt");
  std::string json_file = dir + "/Labels.json";

#ifndef CMAKE_BOOTSTRAP
  // Check whether labels are enabled for this target.
  cmValue targetLabels = target->GetProperty("LABELS");
  cmValue directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  cmValue cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir);
    cmGeneratedFileStream fout(file);

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmExpandList(*targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::string const& l : labels) {
          fout << " " << l << "\n";
          lj_target_labels.append(l);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmExpandList(*directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmExpandList(*cmakeDirectoryLabels, cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::string const& li : directoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    for (std::string const& li : cmakeDirectoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> const& configs =
      target->Target->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);
    for (std::string const& c : configs) {
      target->GetSourceFiles(sources, c);
    }
    auto const sourcesEnd = cmRemoveDuplicates(sources);
    for (cmSourceFile* sf : cmMakeRange(sources.cbegin(), sourcesEnd)) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      std::string const& sfp = sf->ResolveFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (cmValue svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmExpandList(*svalue, labels);
        for (std::string const& label : labels) {
          fout << " " << label << "\n";
          lj_source_labels.append(label);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file);
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}